

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O0

uint32_t helper_uqadd16_aarch64(uint32_t a,uint32_t b)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint32_t res;
  uint32_t b_local;
  uint32_t a_local;
  
  uVar1 = add16_usat((uint16_t)a,(uint16_t)b);
  uVar2 = add16_usat((uint16_t)(a >> 0x10),(uint16_t)(b >> 0x10));
  return CONCAT22(uVar2,uVar1);
}

Assistant:

uint32_t HELPER(glue(PFX,add16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD16(a, b, 0);
    ADD16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}